

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

int Abc_NodeIsMuxType(Abc_Obj_t *pNode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  void **ppvVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  char *__assertion;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcUtil.c"
                  ,0x524,"int Abc_NodeIsMuxType(Abc_Obj_t *)");
  }
  if (pNode->pNtk->ntkType == ABC_NTK_STRASH) {
    if ((pNode->vFanins).nSize != 2) {
      return 0;
    }
    if ((~*(uint *)&pNode->field_0x14 & 0xc00) != 0) {
      return 0;
    }
    piVar4 = (pNode->vFanins).pArray;
    ppvVar5 = pNode->pNtk->vObjs->pArray;
    puVar6 = (undefined8 *)ppvVar5[*piVar4];
    if (((ulong)puVar6 & 1) != 0) {
LAB_001f11ad:
      __assertion = "!Abc_ObjIsComplement(pNode)";
      goto LAB_001f11b4;
    }
    if (*(int *)*puVar6 == 3) {
      if (*(int *)((long)puVar6 + 0x1c) != 2) {
        return 0;
      }
      puVar7 = (undefined8 *)ppvVar5[piVar4[1]];
      if (((ulong)puVar7 & 1) != 0) goto LAB_001f11ad;
      if (*(int *)*puVar7 == 3) {
        if (*(int *)((long)puVar7 + 0x1c) != 2) {
          return 0;
        }
        iVar1 = *(int *)puVar6[4];
        iVar2 = *(int *)puVar7[4];
        if ((iVar1 == iVar2) &&
           (((*(uint *)((long)puVar7 + 0x14) ^ *(uint *)((long)puVar6 + 0x14)) >> 10 & 1) != 0)) {
          return 1;
        }
        iVar3 = ((int *)puVar7[4])[1];
        if ((iVar1 == iVar3) &&
           (((*(uint *)((long)puVar7 + 0x14) >> 0xb ^ *(uint *)((long)puVar6 + 0x14) >> 10) & 1) !=
            0)) {
          return 1;
        }
        iVar1 = ((int *)puVar6[4])[1];
        if ((iVar1 == iVar2) &&
           (((*(uint *)((long)puVar7 + 0x14) >> 10 ^ *(uint *)((long)puVar6 + 0x14) >> 0xb) & 1) !=
            0)) {
          return 1;
        }
        if (iVar1 != iVar3) {
          return 0;
        }
        return (*(uint *)((long)puVar7 + 0x14) ^ *(uint *)((long)puVar6 + 0x14)) >> 0xb & 1;
      }
    }
  }
  __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
LAB_001f11b4:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                ,0x18e,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
}

Assistant:

int Abc_NodeIsMuxType( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pNode0, * pNode1;
    // check that the node is regular
    assert( !Abc_ObjIsComplement(pNode) );
    // if the node is not AND, this is not MUX
    if ( !Abc_AigNodeIsAnd(pNode) )
        return 0;
    // if the children are not complemented, this is not MUX
    if ( !Abc_ObjFaninC0(pNode) || !Abc_ObjFaninC1(pNode) )
        return 0;
    // get children
    pNode0 = Abc_ObjFanin0(pNode);
    pNode1 = Abc_ObjFanin1(pNode);
    // if the children are not ANDs, this is not MUX
    if ( !Abc_AigNodeIsAnd(pNode0) || !Abc_AigNodeIsAnd(pNode1) )
        return 0;
    // otherwise the node is MUX iff it has a pair of equal grandchildren with opposite polarity
    return (Abc_ObjFaninId0(pNode0) == Abc_ObjFaninId0(pNode1) && (Abc_ObjFaninC0(pNode0) ^ Abc_ObjFaninC0(pNode1))) || 
           (Abc_ObjFaninId0(pNode0) == Abc_ObjFaninId1(pNode1) && (Abc_ObjFaninC0(pNode0) ^ Abc_ObjFaninC1(pNode1))) ||
           (Abc_ObjFaninId1(pNode0) == Abc_ObjFaninId0(pNode1) && (Abc_ObjFaninC1(pNode0) ^ Abc_ObjFaninC0(pNode1))) ||
           (Abc_ObjFaninId1(pNode0) == Abc_ObjFaninId1(pNode1) && (Abc_ObjFaninC1(pNode0) ^ Abc_ObjFaninC1(pNode1)));
}